

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timidity.cpp
# Opt level: O0

void __thiscall
Timidity::Renderer::MarkInstrument(Renderer *this,int banknum,int percussion,int instr)

{
  long local_28;
  ToneBank *bank;
  int instr_local;
  int percussion_local;
  int banknum_local;
  Renderer *this_local;
  
  if (banknum < 0x80) {
    if (banknum != 0) {
      MarkInstrument(this,0,percussion,instr);
    }
    if (percussion == 0) {
      local_28 = (&tonebank)[banknum];
    }
    else {
      local_28 = (&drumset)[banknum];
    }
    if ((local_28 != 0) && (*(long *)(local_28 + 8 + (long)instr * 8) == 0)) {
      *(undefined8 *)(local_28 + 8 + (long)instr * 8) = 0xffffffffffffffff;
    }
  }
  return;
}

Assistant:

void Renderer::MarkInstrument(int banknum, int percussion, int instr)
{
	ToneBank *bank;

	if (banknum >= MAXBANK)
	{
		return;
	}
	if (banknum != 0)
	{
		/* Mark the standard bank in case it's not defined by this one. */
		MarkInstrument(0, percussion, instr);
	}
	if (percussion)
	{
		bank = drumset[banknum];
	}
	else
	{
		bank = tonebank[banknum];
	}
	if (bank == NULL)
	{
		return;
	}
	if (bank->instrument[instr] == NULL)
	{
		bank->instrument[instr] = MAGIC_LOAD_INSTRUMENT;
	}
}